

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  int iVar1;
  int iVar2;
  xmlRegexpPtr pxVar3;
  xmlGenericErrorFunc p_Var4;
  long lVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  long *plVar8;
  int local_84;
  xmlRegCounter *pxStack_80;
  int count;
  xmlRegCounterPtr counter;
  xmlRegStatePtr state_1;
  xmlRegAtomPtr atom;
  xmlRegTransPtr trans;
  int transno;
  int state;
  int i;
  int target;
  xmlRegexpPtr comp;
  int nb;
  int maxval;
  int *terminal_local;
  xmlChar **values_local;
  int *nbneg_local;
  int *nbval_local;
  int err_local;
  xmlRegExecCtxtPtr exec_local;
  
  comp._0_4_ = 0;
  if ((((exec != (xmlRegExecCtxtPtr)0x0) && (nbval != (int *)0x0)) && (nbneg != (int *)0x0)) &&
     ((values != (xmlChar **)0x0 && (0 < *nbval)))) {
    iVar1 = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp == (xmlRegexpPtr)0x0) || (exec->comp->compact == (int *)0x0)) {
      if (terminal != (int *)0x0) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE) {
          *terminal = 1;
        }
        else {
          *terminal = 0;
        }
      }
      if (err == 0) {
        if (exec->state == (xmlRegStatePtr)0x0) {
          return -1;
        }
        counter = (xmlRegCounterPtr)exec->state;
      }
      else {
        if (exec->errState == (xmlRegStatePtr)0x0) {
          return -1;
        }
        counter = (xmlRegCounterPtr)exec->errState;
      }
      for (trans._0_4_ = 0; (int)trans < counter[3].min && (int)comp < iVar1;
          trans._0_4_ = (int)trans + 1) {
        plVar8 = (long *)((long)counter[4] + (long)(int)trans * 0x18);
        if (((-1 < (int)plVar8[1]) && (lVar5 = *plVar8, lVar5 != 0)) &&
           (*(long *)(lVar5 + 0x18) != 0)) {
          if ((int)plVar8[2] == 0x123457) {
            pp_Var6 = __xmlGenericError();
            p_Var4 = *pp_Var6;
            ppvVar7 = __xmlGenericErrorContext();
            (*p_Var4)(*ppvVar7,"Unimplemented block at %s:%d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlregexp.c"
                      ,0x110d);
          }
          else if ((int)plVar8[2] == 0x123456) {
            pp_Var6 = __xmlGenericError();
            p_Var4 = *pp_Var6;
            ppvVar7 = __xmlGenericErrorContext();
            (*p_Var4)(*ppvVar7,"Unimplemented block at %s:%d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlregexp.c"
                      ,0x1110);
          }
          else if (*(int *)((long)plVar8 + 0xc) < 0) {
            if (((exec->comp != (xmlRegexpPtr)0x0) &&
                (exec->comp->states[(int)plVar8[1]] != (xmlRegStatePtr)0x0)) &&
               (exec->comp->states[(int)plVar8[1]]->type != XML_REGEXP_SINK_STATE)) {
              if (*(int *)(lVar5 + 0x28) == 0) {
                values[(int)comp] = *(xmlChar **)(lVar5 + 0x18);
              }
              else {
                values[(int)comp] = *(xmlChar **)(lVar5 + 0x20);
              }
              comp._0_4_ = (int)comp + 1;
              *nbval = *nbval + 1;
            }
          }
          else {
            pxStack_80 = (xmlRegCounter *)0x0;
            if (err == 0) {
              local_84 = exec->counts[*(int *)((long)plVar8 + 0xc)];
            }
            else {
              local_84 = exec->errCounts[*(int *)((long)plVar8 + 0xc)];
            }
            if (exec->comp != (xmlRegexpPtr)0x0) {
              pxStack_80 = exec->comp->counters + *(int *)((long)plVar8 + 0xc);
            }
            if ((pxStack_80 == (xmlRegCounter *)0x0) || (local_84 < pxStack_80->max)) {
              if (*(int *)(lVar5 + 0x28) == 0) {
                values[(int)comp] = *(xmlChar **)(lVar5 + 0x18);
              }
              else {
                values[(int)comp] = *(xmlChar **)(lVar5 + 0x20);
              }
              comp._0_4_ = (int)comp + 1;
              *nbval = *nbval + 1;
            }
          }
        }
      }
      for (trans._0_4_ = 0; (int)trans < counter[3].min && (int)comp < iVar1;
          trans._0_4_ = (int)trans + 1) {
        plVar8 = (long *)((long)counter[4] + (long)(int)trans * 0x18);
        if (((((-1 < (int)plVar8[1]) && (lVar5 = *plVar8, lVar5 != 0)) &&
             (*(long *)(lVar5 + 0x18) != 0)) &&
            (((int)plVar8[2] != 0x123457 && ((int)plVar8[2] != 0x123456)))) &&
           ((*(int *)((long)plVar8 + 0xc) < 0 &&
            ((exec->comp->states[(int)plVar8[1]] != (xmlRegStatePtr)0x0 &&
             (exec->comp->states[(int)plVar8[1]]->type == XML_REGEXP_SINK_STATE)))))) {
          if (*(int *)(lVar5 + 0x28) == 0) {
            values[(int)comp] = *(xmlChar **)(lVar5 + 0x18);
          }
          else {
            values[(int)comp] = *(xmlChar **)(lVar5 + 0x20);
          }
          comp._0_4_ = (int)comp + 1;
          *nbneg = *nbneg + 1;
        }
      }
    }
    else {
      pxVar3 = exec->comp;
      if (err == 0) {
        trans._4_4_ = exec->index;
      }
      else {
        if (exec->errStateNo == -1) {
          return -1;
        }
        trans._4_4_ = exec->errStateNo;
      }
      if (terminal != (int *)0x0) {
        if (pxVar3->compact[trans._4_4_ * (pxVar3->nbstrings + 1)] == 2) {
          *terminal = 1;
        }
        else {
          *terminal = 0;
        }
      }
      for (transno = 0; transno < pxVar3->nbstrings && (int)comp < iVar1; transno = transno + 1) {
        iVar2 = pxVar3->compact[trans._4_4_ * (pxVar3->nbstrings + 1) + transno + 1];
        if (((0 < iVar2) && (iVar2 <= pxVar3->nbstates)) &&
           (pxVar3->compact[(iVar2 + -1) * (pxVar3->nbstrings + 1)] != 4)) {
          values[(int)comp] = pxVar3->stringMap[transno];
          *nbval = *nbval + 1;
          comp._0_4_ = (int)comp + 1;
        }
      }
      for (transno = 0; transno < pxVar3->nbstrings && (int)comp < iVar1; transno = transno + 1) {
        iVar2 = pxVar3->compact[trans._4_4_ * (pxVar3->nbstrings + 1) + transno + 1];
        if (((0 < iVar2) && (iVar2 <= pxVar3->nbstates)) &&
           (pxVar3->compact[(iVar2 + -1) * (pxVar3->nbstrings + 1)] == 4)) {
          values[(int)comp] = pxVar3->stringMap[transno];
          *nbneg = *nbneg + 1;
          comp._0_4_ = (int)comp + 1;
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}